

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t archive_entry_update_symlink_utf8(archive_entry *entry,char *linkname)

{
  wchar_t wVar1;
  int *piVar2;
  char *linkname_local;
  archive_entry *entry_local;
  
  if (linkname == (char *)0x0) {
    entry->ae_set = entry->ae_set & 0xfffffffd;
  }
  else {
    entry->ae_set = entry->ae_set | 2;
  }
  wVar1 = archive_mstring_update_utf8(entry->archive,&entry->ae_symlink,linkname);
  if (wVar1 == L'\0') {
    entry_local._4_4_ = L'\x01';
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      __archive_errx(1,"No memory");
    }
    entry_local._4_4_ = L'\0';
  }
  return entry_local._4_4_;
}

Assistant:

int
archive_entry_update_symlink_utf8(struct archive_entry *entry, const char *linkname)
{
	if (linkname != NULL)
		entry->ae_set |= AE_SET_SYMLINK;
	else
		entry->ae_set &= ~AE_SET_SYMLINK;
	if (archive_mstring_update_utf8(entry->archive,
	    &entry->ae_symlink, linkname) == 0)
		return (1);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (0);
}